

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

bool embree::avx512::DiscMiMBIntersectorK<4,_16,_true>::occluded
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *Disc
               )

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Scene *pSVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  float fVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  byte bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar61;
  float fVar62;
  undefined1 auVar60 [16];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  RTCFilterFunctionNArguments local_3f0;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [16];
  float local_370 [4];
  float local_360 [4];
  float local_350 [4];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar56 [64];
  undefined1 auVar67 [64];
  
  pSVar7 = context->scene;
  pGVar8 = (pSVar7->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar8->time_range).lower;
  uVar37 = (ulong)(Disc->primIDs).field_0.i[0];
  fVar29 = pGVar8->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x1c0) - fVar1) / ((pGVar8->time_range).upper - fVar1));
  auVar48 = vroundss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29),9);
  auVar48 = vminss_avx(auVar48,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar40 = vmaxss_avx(ZEXT816(0) << 0x20,auVar48);
  lVar9 = *(long *)&pGVar8[2].numPrimitives;
  lVar34 = (long)(int)auVar40._0_4_ * 0x38;
  lVar10 = *(long *)(lVar9 + lVar34);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar34);
  auVar48 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar37);
  uVar35 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar49 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar35);
  uVar33 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar41 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar33);
  uVar36 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar50 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar36);
  lVar10 = *(long *)(lVar9 + 0x38 + lVar34);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar34);
  auVar52 = *(undefined1 (*) [16])(lVar10 + uVar37 * lVar9);
  auVar5 = *(undefined1 (*) [16])(lVar10 + uVar35 * lVar9);
  auVar43 = *(undefined1 (*) [16])(lVar10 + uVar33 * lVar9);
  auVar6 = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar36);
  auVar39 = vpbroadcastd_avx512vl();
  local_3b0 = vpbroadcastd_avx512vl();
  fVar29 = fVar29 - auVar40._0_4_;
  auVar40 = vunpcklps_avx(auVar48,auVar41);
  auVar48 = vunpckhps_avx(auVar48,auVar41);
  auVar41 = vunpcklps_avx(auVar49,auVar50);
  auVar49 = vunpckhps_avx(auVar49,auVar50);
  auVar42 = vunpcklps_avx(auVar40,auVar41);
  auVar41 = vunpckhps_avx(auVar40,auVar41);
  auVar40 = vunpcklps_avx(auVar48,auVar49);
  auVar46 = vunpcklps_avx(auVar52,auVar43);
  auVar50 = vunpckhps_avx(auVar52,auVar43);
  auVar43 = vunpcklps_avx(auVar5,auVar6);
  auVar52 = vunpckhps_avx(auVar5,auVar6);
  auVar6 = vunpcklps_avx(auVar46,auVar43);
  auVar5 = vunpckhps_avx(auVar46,auVar43);
  auVar43 = vunpcklps_avx(auVar50,auVar52);
  fVar1 = 1.0 - fVar29;
  auVar58._4_4_ = fVar1;
  auVar58._0_4_ = fVar1;
  auVar58._8_4_ = fVar1;
  auVar58._12_4_ = fVar1;
  auVar57._0_4_ = fVar29 * auVar6._0_4_;
  auVar57._4_4_ = fVar29 * auVar6._4_4_;
  auVar57._8_4_ = fVar29 * auVar6._8_4_;
  auVar57._12_4_ = fVar29 * auVar6._12_4_;
  auVar60._0_4_ = fVar29 * auVar5._0_4_;
  auVar60._4_4_ = fVar29 * auVar5._4_4_;
  auVar60._8_4_ = fVar29 * auVar5._8_4_;
  auVar60._12_4_ = fVar29 * auVar5._12_4_;
  auVar64._0_4_ = fVar29 * auVar43._0_4_;
  auVar64._4_4_ = fVar29 * auVar43._4_4_;
  auVar64._8_4_ = fVar29 * auVar43._8_4_;
  auVar64._12_4_ = fVar29 * auVar43._12_4_;
  auVar5 = vfmadd231ps_fma(auVar57,auVar58,auVar42);
  auVar43 = vfmadd231ps_fma(auVar60,auVar58,auVar41);
  auVar6 = vfmadd231ps_fma(auVar64,auVar58,auVar40);
  fVar1 = *(float *)(ray + k * 4 + 0x100);
  auVar46._4_4_ = fVar1;
  auVar46._0_4_ = fVar1;
  auVar46._8_4_ = fVar1;
  auVar46._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x140);
  auVar47._4_4_ = fVar2;
  auVar47._0_4_ = fVar2;
  auVar47._8_4_ = fVar2;
  auVar47._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x180);
  auVar41 = vfmadd231ps_fma(ZEXT416((uint)(fVar3 * fVar3)),auVar47,auVar47);
  auVar41 = vfmadd231ps_fma(auVar41,auVar46,auVar46);
  auVar42._0_4_ = auVar41._0_4_;
  auVar42._4_4_ = auVar42._0_4_;
  auVar42._8_4_ = auVar42._0_4_;
  auVar42._12_4_ = auVar42._0_4_;
  auVar40 = vrcp14ps_avx512vl(auVar42);
  auVar41._8_4_ = 0x3f800000;
  auVar41._0_8_ = 0x3f8000003f800000;
  auVar41._12_4_ = 0x3f800000;
  auVar41 = vfnmadd213ps_avx512vl(auVar42,auVar40,auVar41);
  auVar41 = vfmadd132ps_fma(auVar41,auVar40,auVar40);
  uVar4 = *(undefined4 *)(ray + k * 4);
  auVar40._4_4_ = uVar4;
  auVar40._0_4_ = uVar4;
  auVar40._8_4_ = uVar4;
  auVar40._12_4_ = uVar4;
  auVar40 = vsubps_avx512vl(auVar5,auVar40);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar5._4_4_ = uVar4;
  auVar5._0_4_ = uVar4;
  auVar5._8_4_ = uVar4;
  auVar5._12_4_ = uVar4;
  auVar42 = vsubps_avx512vl(auVar43,auVar5);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar43._4_4_ = uVar4;
  auVar43._0_4_ = uVar4;
  auVar43._8_4_ = uVar4;
  auVar43._12_4_ = uVar4;
  auVar43 = vsubps_avx512vl(auVar6,auVar43);
  fVar59 = auVar43._0_4_;
  auVar65._0_4_ = fVar59 * fVar3;
  fVar61 = auVar43._4_4_;
  auVar65._4_4_ = fVar61 * fVar3;
  fVar62 = auVar43._8_4_;
  auVar65._8_4_ = fVar62 * fVar3;
  fVar63 = auVar43._12_4_;
  auVar65._12_4_ = fVar63 * fVar3;
  auVar5 = vfmadd231ps_fma(auVar65,auVar42,auVar47);
  auVar5 = vfmadd231ps_fma(auVar5,auVar40,auVar46);
  local_380._0_4_ = auVar5._0_4_ * auVar41._0_4_;
  local_380._4_4_ = auVar5._4_4_ * auVar41._4_4_;
  local_380._8_4_ = auVar5._8_4_ * auVar41._8_4_;
  local_380._12_4_ = auVar5._12_4_ * auVar41._12_4_;
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar66._4_4_ = uVar4;
  auVar66._0_4_ = uVar4;
  auVar66._8_4_ = uVar4;
  auVar66._12_4_ = uVar4;
  auVar67 = ZEXT1664(auVar66);
  uVar30 = vcmpps_avx512vl(local_380,auVar66,2);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar6._4_4_ = uVar4;
  auVar6._0_4_ = uVar4;
  auVar6._8_4_ = uVar4;
  auVar6._12_4_ = uVar4;
  uVar31 = vcmpps_avx512vl(local_380,auVar6,0xd);
  uVar32 = vpcmpgtd_avx512vl(auVar39,_DAT_01f7fcf0);
  bVar38 = (byte)uVar30 & (byte)uVar31 & 0xf & (byte)uVar32;
  if (bVar38 != 0) {
    auVar48 = vunpckhps_avx(auVar48,auVar49);
    auVar49 = vunpckhps_avx(auVar50,auVar52);
    auVar50._0_4_ = fVar29 * auVar49._0_4_;
    auVar50._4_4_ = fVar29 * auVar49._4_4_;
    auVar50._8_4_ = fVar29 * auVar49._8_4_;
    auVar50._12_4_ = fVar29 * auVar49._12_4_;
    auVar50 = vfmadd231ps_fma(auVar50,auVar58,auVar48);
    auVar48._0_4_ = fVar1 * local_380._0_4_;
    auVar48._4_4_ = fVar1 * local_380._4_4_;
    auVar48._8_4_ = fVar1 * local_380._8_4_;
    auVar48._12_4_ = fVar1 * local_380._12_4_;
    auVar52._0_4_ = fVar2 * local_380._0_4_;
    auVar52._4_4_ = fVar2 * local_380._4_4_;
    auVar52._8_4_ = fVar2 * local_380._8_4_;
    auVar52._12_4_ = fVar2 * local_380._12_4_;
    auVar39._0_4_ = fVar3 * local_380._0_4_;
    auVar39._4_4_ = fVar3 * local_380._4_4_;
    auVar39._8_4_ = fVar3 * local_380._8_4_;
    auVar39._12_4_ = fVar3 * local_380._12_4_;
    auVar48 = vsubps_avx(auVar40,auVar48);
    auVar49 = vsubps_avx(auVar42,auVar52);
    auVar41 = vsubps_avx(auVar43,auVar39);
    auVar53._0_4_ = auVar41._0_4_ * auVar41._0_4_;
    auVar53._4_4_ = auVar41._4_4_ * auVar41._4_4_;
    auVar53._8_4_ = auVar41._8_4_ * auVar41._8_4_;
    auVar53._12_4_ = auVar41._12_4_ * auVar41._12_4_;
    auVar49 = vfmadd231ps_fma(auVar53,auVar49,auVar49);
    auVar48 = vfmadd231ps_fma(auVar49,auVar48,auVar48);
    auVar49._0_4_ = auVar50._0_4_ * auVar50._0_4_;
    auVar49._4_4_ = auVar50._4_4_ * auVar50._4_4_;
    auVar49._8_4_ = auVar50._8_4_ * auVar50._8_4_;
    auVar49._12_4_ = auVar50._12_4_ * auVar50._12_4_;
    uVar30 = vcmpps_avx512vl(auVar48,auVar49,2);
    bVar38 = (byte)uVar30 & bVar38;
    if (bVar38 != 0) {
      auVar51._0_4_ = fVar59 * fVar59;
      auVar51._4_4_ = fVar61 * fVar61;
      auVar51._8_4_ = fVar62 * fVar62;
      auVar51._12_4_ = fVar63 * fVar63;
      auVar48 = vfmadd213ps_fma(auVar42,auVar42,auVar51);
      auVar48 = vfmadd213ps_fma(auVar40,auVar40,auVar48);
      uVar30 = vcmpps_avx512vl(auVar48,auVar49,6);
      if ((bVar38 & (byte)uVar30) != 0) {
        local_3a0 = ZEXT432(0) << 0x20;
        local_370[0] = -fVar1;
        local_370[1] = -fVar1;
        local_370[2] = -fVar1;
        local_370[3] = -fVar1;
        local_360[0] = -fVar2;
        local_360[1] = -fVar2;
        local_360[2] = -fVar2;
        local_360[3] = -fVar2;
        local_350[0] = -fVar3;
        local_350[1] = -fVar3;
        local_350[2] = -fVar3;
        local_350[3] = -fVar3;
        uVar37 = (ulong)(bVar38 & (byte)uVar30);
        auVar54 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
        auVar55 = ZEXT1632(CONCAT412(fVar29,CONCAT48(fVar29,CONCAT44(fVar29,fVar29))));
        auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
        auVar56 = ZEXT3264(auVar55);
        do {
          local_3f0.hit = local_2c0;
          local_3f0.valid = (int *)local_340;
          uVar35 = 0;
          for (uVar33 = uVar37; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
            uVar35 = uVar35 + 1;
          }
          pGVar8 = (pSVar7->geometries).items[*(uint *)(local_3b0 + uVar35 * 4)].ptr;
          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              return true;
            }
            uVar33 = (ulong)(uint)((int)uVar35 * 4);
            local_200 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_3a0 + uVar33)));
            local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_3a0 + uVar33 + 0x10)));
            *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_380 + uVar33);
            local_3f0.context = context->user;
            auVar44 = vpbroadcastd_avx512f();
            local_180 = vbroadcastss_avx512f
                                  (ZEXT416(*(uint *)((long)&(Disc->primIDs).field_0 + uVar33)));
            auVar45 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_370 + uVar33)));
            local_280 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_360 + uVar33)));
            local_240 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_350 + uVar33)));
            local_2c0[0] = (RTCHitN)auVar45[0];
            local_2c0[1] = (RTCHitN)auVar45[1];
            local_2c0[2] = (RTCHitN)auVar45[2];
            local_2c0[3] = (RTCHitN)auVar45[3];
            local_2c0[4] = (RTCHitN)auVar45[4];
            local_2c0[5] = (RTCHitN)auVar45[5];
            local_2c0[6] = (RTCHitN)auVar45[6];
            local_2c0[7] = (RTCHitN)auVar45[7];
            local_2c0[8] = (RTCHitN)auVar45[8];
            local_2c0[9] = (RTCHitN)auVar45[9];
            local_2c0[10] = (RTCHitN)auVar45[10];
            local_2c0[0xb] = (RTCHitN)auVar45[0xb];
            local_2c0[0xc] = (RTCHitN)auVar45[0xc];
            local_2c0[0xd] = (RTCHitN)auVar45[0xd];
            local_2c0[0xe] = (RTCHitN)auVar45[0xe];
            local_2c0[0xf] = (RTCHitN)auVar45[0xf];
            local_2c0[0x10] = (RTCHitN)auVar45[0x10];
            local_2c0[0x11] = (RTCHitN)auVar45[0x11];
            local_2c0[0x12] = (RTCHitN)auVar45[0x12];
            local_2c0[0x13] = (RTCHitN)auVar45[0x13];
            local_2c0[0x14] = (RTCHitN)auVar45[0x14];
            local_2c0[0x15] = (RTCHitN)auVar45[0x15];
            local_2c0[0x16] = (RTCHitN)auVar45[0x16];
            local_2c0[0x17] = (RTCHitN)auVar45[0x17];
            local_2c0[0x18] = (RTCHitN)auVar45[0x18];
            local_2c0[0x19] = (RTCHitN)auVar45[0x19];
            local_2c0[0x1a] = (RTCHitN)auVar45[0x1a];
            local_2c0[0x1b] = (RTCHitN)auVar45[0x1b];
            local_2c0[0x1c] = (RTCHitN)auVar45[0x1c];
            local_2c0[0x1d] = (RTCHitN)auVar45[0x1d];
            local_2c0[0x1e] = (RTCHitN)auVar45[0x1e];
            local_2c0[0x1f] = (RTCHitN)auVar45[0x1f];
            local_2c0[0x20] = (RTCHitN)auVar45[0x20];
            local_2c0[0x21] = (RTCHitN)auVar45[0x21];
            local_2c0[0x22] = (RTCHitN)auVar45[0x22];
            local_2c0[0x23] = (RTCHitN)auVar45[0x23];
            local_2c0[0x24] = (RTCHitN)auVar45[0x24];
            local_2c0[0x25] = (RTCHitN)auVar45[0x25];
            local_2c0[0x26] = (RTCHitN)auVar45[0x26];
            local_2c0[0x27] = (RTCHitN)auVar45[0x27];
            local_2c0[0x28] = (RTCHitN)auVar45[0x28];
            local_2c0[0x29] = (RTCHitN)auVar45[0x29];
            local_2c0[0x2a] = (RTCHitN)auVar45[0x2a];
            local_2c0[0x2b] = (RTCHitN)auVar45[0x2b];
            local_2c0[0x2c] = (RTCHitN)auVar45[0x2c];
            local_2c0[0x2d] = (RTCHitN)auVar45[0x2d];
            local_2c0[0x2e] = (RTCHitN)auVar45[0x2e];
            local_2c0[0x2f] = (RTCHitN)auVar45[0x2f];
            local_2c0[0x30] = (RTCHitN)auVar45[0x30];
            local_2c0[0x31] = (RTCHitN)auVar45[0x31];
            local_2c0[0x32] = (RTCHitN)auVar45[0x32];
            local_2c0[0x33] = (RTCHitN)auVar45[0x33];
            local_2c0[0x34] = (RTCHitN)auVar45[0x34];
            local_2c0[0x35] = (RTCHitN)auVar45[0x35];
            local_2c0[0x36] = (RTCHitN)auVar45[0x36];
            local_2c0[0x37] = (RTCHitN)auVar45[0x37];
            local_2c0[0x38] = (RTCHitN)auVar45[0x38];
            local_2c0[0x39] = (RTCHitN)auVar45[0x39];
            local_2c0[0x3a] = (RTCHitN)auVar45[0x3a];
            local_2c0[0x3b] = (RTCHitN)auVar45[0x3b];
            local_2c0[0x3c] = (RTCHitN)auVar45[0x3c];
            local_2c0[0x3d] = (RTCHitN)auVar45[0x3d];
            local_2c0[0x3e] = (RTCHitN)auVar45[0x3e];
            local_2c0[0x3f] = (RTCHitN)auVar45[0x3f];
            local_140 = vmovdqa64_avx512f(auVar44);
            local_100 = vbroadcastss_avx512f(ZEXT416((local_3f0.context)->instID[0]));
            local_c0 = vbroadcastss_avx512f(ZEXT416((local_3f0.context)->instPrimID[0]));
            local_340 = vmovdqa64_avx512f(auVar54);
            local_3f0.geometryUserPtr = pGVar8->userPtr;
            local_3f0.N = 0x10;
            auVar44 = vmovdqa64_avx512f(auVar54);
            local_3c0 = auVar67._0_16_;
            local_300 = vmovdqa64_avx512f(auVar54);
            local_3f0.ray = (RTCRayN *)ray;
            if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar55 = ZEXT1632(auVar56._0_16_);
              (*pGVar8->occlusionFilterN)(&local_3f0);
              auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
              auVar56 = ZEXT3264(auVar55);
              auVar54 = vmovdqa64_avx512f(local_300);
              auVar67 = ZEXT1664(local_3c0);
              auVar44 = vmovdqa64_avx512f(local_340);
            }
            uVar30 = vptestmd_avx512f(auVar44,auVar44);
            if ((short)uVar30 != 0) {
              p_Var12 = context->args->filter;
              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                auVar55 = ZEXT1632(auVar56._0_16_);
                (*p_Var12)(&local_3f0);
                auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
                auVar56 = ZEXT3264(auVar55);
                auVar54 = vmovdqa64_avx512f(local_300);
                auVar67 = ZEXT1664(local_3c0);
                auVar44 = vmovdqa64_avx512f(local_340);
              }
              uVar33 = vptestmd_avx512f(auVar44,auVar44);
              auVar44 = vbroadcastss_avx512f(ZEXT416(0xff800000));
              bVar13 = (bool)((byte)uVar33 & 1);
              bVar14 = (bool)((byte)(uVar33 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar33 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar33 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar33 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar33 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar33 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar33 >> 7) & 1);
              bVar21 = (bool)((byte)(uVar33 >> 8) & 1);
              bVar22 = (bool)((byte)(uVar33 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar33 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar33 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar33 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar33 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar33 >> 0xe) & 1);
              bVar28 = SUB81(uVar33 >> 0xf,0);
              *(uint *)(local_3f0.ray + 0x200) =
                   (uint)bVar13 * auVar44._0_4_ | (uint)!bVar13 * *(int *)(local_3f0.ray + 0x200);
              *(uint *)(local_3f0.ray + 0x204) =
                   (uint)bVar14 * auVar44._4_4_ | (uint)!bVar14 * *(int *)(local_3f0.ray + 0x204);
              *(uint *)(local_3f0.ray + 0x208) =
                   (uint)bVar15 * auVar44._8_4_ | (uint)!bVar15 * *(int *)(local_3f0.ray + 0x208);
              *(uint *)(local_3f0.ray + 0x20c) =
                   (uint)bVar16 * auVar44._12_4_ | (uint)!bVar16 * *(int *)(local_3f0.ray + 0x20c);
              *(uint *)(local_3f0.ray + 0x210) =
                   (uint)bVar17 * auVar44._16_4_ | (uint)!bVar17 * *(int *)(local_3f0.ray + 0x210);
              *(uint *)(local_3f0.ray + 0x214) =
                   (uint)bVar18 * auVar44._20_4_ | (uint)!bVar18 * *(int *)(local_3f0.ray + 0x214);
              *(uint *)(local_3f0.ray + 0x218) =
                   (uint)bVar19 * auVar44._24_4_ | (uint)!bVar19 * *(int *)(local_3f0.ray + 0x218);
              *(uint *)(local_3f0.ray + 0x21c) =
                   (uint)bVar20 * auVar44._28_4_ | (uint)!bVar20 * *(int *)(local_3f0.ray + 0x21c);
              *(uint *)(local_3f0.ray + 0x220) =
                   (uint)bVar21 * auVar44._32_4_ | (uint)!bVar21 * *(int *)(local_3f0.ray + 0x220);
              *(uint *)(local_3f0.ray + 0x224) =
                   (uint)bVar22 * auVar44._36_4_ | (uint)!bVar22 * *(int *)(local_3f0.ray + 0x224);
              *(uint *)(local_3f0.ray + 0x228) =
                   (uint)bVar23 * auVar44._40_4_ | (uint)!bVar23 * *(int *)(local_3f0.ray + 0x228);
              *(uint *)(local_3f0.ray + 0x22c) =
                   (uint)bVar24 * auVar44._44_4_ | (uint)!bVar24 * *(int *)(local_3f0.ray + 0x22c);
              *(uint *)(local_3f0.ray + 0x230) =
                   (uint)bVar25 * auVar44._48_4_ | (uint)!bVar25 * *(int *)(local_3f0.ray + 0x230);
              *(uint *)(local_3f0.ray + 0x234) =
                   (uint)bVar26 * auVar44._52_4_ | (uint)!bVar26 * *(int *)(local_3f0.ray + 0x234);
              *(uint *)(local_3f0.ray + 0x238) =
                   (uint)bVar27 * auVar44._56_4_ | (uint)!bVar27 * *(int *)(local_3f0.ray + 0x238);
              *(uint *)(local_3f0.ray + 0x23c) =
                   (uint)bVar28 * auVar44._60_4_ | (uint)!bVar28 * *(int *)(local_3f0.ray + 0x23c);
              if ((short)uVar33 != 0) {
                return true;
              }
            }
            *(int *)(ray + k * 4 + 0x200) = auVar67._0_4_;
          }
          uVar37 = uVar37 ^ 1L << (uVar35 & 0x3f);
        } while (uVar37 != 0);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0, Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }